

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafe::EnergyScan
          (CommissionerSafe *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint8_t aCount,
          uint16_t aPeriod,uint16_t aScanDuration,string *aDstAddr)

{
  pointer pcVar1;
  _func_void *p_Var2;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  CommissionerSafe *local_90;
  CommissionerSafe *local_88;
  _Any_data local_80;
  code *local_70;
  undefined8 uStack_68;
  uint32_t local_60;
  uint8_t uStack_5c;
  undefined1 uStack_5b;
  uint16_t uStack_5a;
  uint16_t local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_90 = this;
  local_88 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_80,aHandler);
  pcVar1 = (aDstAddr->_M_dataplus)._M_p;
  local_60 = aChannelMask;
  uStack_5c = aCount;
  uStack_5a = aPeriod;
  local_58 = aScanDuration;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + aDstAddr->_M_string_length);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  p_Var2 = (_func_void *)operator_new(0x58);
  *(CommissionerSafe **)p_Var2 = local_88;
  *(undefined8 *)(p_Var2 + 8) = 0;
  *(undefined8 *)(p_Var2 + 0x10) = 0;
  *(undefined8 *)(p_Var2 + 0x18) = 0;
  *(undefined8 *)(p_Var2 + 0x20) = uStack_68;
  if (local_70 != (code *)0x0) {
    *(void **)(p_Var2 + 8) = local_80._M_unused._M_object;
    *(undefined8 *)(p_Var2 + 0x10) = local_80._8_8_;
    *(code **)(p_Var2 + 0x18) = local_70;
    local_70 = (code *)0x0;
    uStack_68 = 0;
  }
  *(uint16_t *)(p_Var2 + 0x30) = local_58;
  *(ulong *)(p_Var2 + 0x28) = CONCAT26(uStack_5a,CONCAT15(uStack_5b,CONCAT14(uStack_5c,local_60)));
  *(_func_void **)(p_Var2 + 0x38) = p_Var2 + 0x48;
  std::__cxx11::string::_M_construct<char*>((string *)(p_Var2 + 0x38),local_50,local_50 + local_48);
  pcStack_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:509:22)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:509:22)>
             ::_M_manager;
  local_b8._M_unused._0_8_ = (undefined8)p_Var2;
  PushAsyncRequest(local_90,(AsyncRequest *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerSafe::EnergyScan(ErrorHandler       aHandler,
                                  uint32_t           aChannelMask,
                                  uint8_t            aCount,
                                  uint16_t           aPeriod,
                                  uint16_t           aScanDuration,
                                  const std::string &aDstAddr)
{
    PushAsyncRequest([=]() { mImpl->EnergyScan(aHandler, aChannelMask, aCount, aPeriod, aScanDuration, aDstAddr); });
}